

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fill<kj::ArrayPtr<char_const>,kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
                 (char *target,ArrayPtr<const_char> *first,
                 Delimited<kj::ArrayPtr<const_unsigned_char>_> *rest)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = first->ptr;
  sVar1 = first->size_;
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    target[sVar3] = pcVar2[sVar3];
  }
  pcVar2 = Delimited<kj::ArrayPtr<const_unsigned_char>_>::flattenTo(rest,target + sVar3);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}